

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

sysbvm_object_tuple_t *
sysbvm_context_allocateByteTuple(sysbvm_context_t *context,sysbvm_tuple_t type,size_t byteSize)

{
  sysbvm_object_tuple_t *psVar1;
  size_t sVar2;
  
  if (context != (sysbvm_context_t *)0x0) {
    psVar1 = sysbvm_heap_allocateByteTuple(&context->heap,byteSize);
    sVar2 = (context->identityHashSeed * 0x41c64e6d & 0x7ffffffffffffff) + 0x3039;
    context->identityHashSeed = sVar2;
    (psVar1->header).identityHashAndFlags =
         (int)sVar2 << 10 | (psVar1->header).identityHashAndFlags & 0x3ff;
    (psVar1->header).field_0.typePointer = type;
    return psVar1;
  }
  return (sysbvm_object_tuple_t *)0x0;
}

Assistant:

sysbvm_object_tuple_t *sysbvm_context_allocateByteTuple(sysbvm_context_t *context, sysbvm_tuple_t type, size_t byteSize)
{
    if(!context) return 0;

    sysbvm_object_tuple_t *result = sysbvm_heap_allocateByteTuple(&context->heap, byteSize);
    sysbvm_tuple_setIdentityHash(result, sysbvm_context_generateIdentityHash(context));
    if(result)
        sysbvm_tuple_setType(result, type);
    return result;
}